

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slip.c
# Opt level: O3

void slip_encode(void *_slip,uint8_t *payload,uint16_t len)

{
  uint8_t uVar1;
  code *pcVar2;
  undefined2 in_register_00000012;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xc0);
  if (CONCAT22(in_register_00000012,len) != 0) {
    uVar5 = 0;
    do {
      uVar1 = payload[uVar5];
      uVar4 = *(undefined8 *)((long)_slip + 8);
      pcVar2 = *(code **)((long)_slip + 0x20);
      if (uVar1 == 0xdb) {
        (*pcVar2)(uVar4,0xdb);
        uVar4 = *(undefined8 *)((long)_slip + 8);
        uVar3 = 0xdd;
LAB_0010280b:
        (**(code **)((long)_slip + 0x20))(uVar4,uVar3);
      }
      else {
        if (uVar1 == 0xc0) {
          (*pcVar2)(uVar4,0xdb);
          uVar4 = *(undefined8 *)((long)_slip + 8);
          uVar3 = 0xdc;
          goto LAB_0010280b;
        }
        (*pcVar2)(uVar4,uVar1);
      }
      uVar5 = uVar5 + 1;
    } while (len != uVar5);
  }
  (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xc0);
  return;
}

Assistant:

void slip_encode(void *_slip, const uint8_t *payload, uint16_t len)
{
    struct slip *slip = (struct slip *)_slip;
    slip->putch(slip->ctx, SLIP_END);
    for(uint16_t i = 0;i < len;i++) {
        if(payload[i] == SLIP_END) {
            slip->putch(slip->ctx, SLIP_ESC);
            slip->putch(slip->ctx, SLIP_ESC_END);
        } else if(payload[i] == SLIP_ESC) {
            slip->putch(slip->ctx, SLIP_ESC);
            slip->putch(slip->ctx, SLIP_ESC_ESC);
        } else {
            slip->putch(slip->ctx, payload[i]);
        }
    }
    slip->putch(slip->ctx, SLIP_END);
}